

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void RangeEnc_Init(CRangeEnc *p)

{
  CRangeEnc *p_local;
  
  p->low = 0;
  p->range = 0xffffffff;
  p->cacheSize = 1;
  p->cache = '\0';
  p->buf = p->bufBase;
  p->processed = 0;
  p->res = 0;
  return;
}

Assistant:

static void RangeEnc_Init(CRangeEnc *p)
{
  /* Stream.Init(); */
  p->low = 0;
  p->range = 0xFFFFFFFF;
  p->cacheSize = 1;
  p->cache = 0;

  p->buf = p->bufBase;

  p->processed = 0;
  p->res = SZ_OK;
}